

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::setScenePosItemEnabled
          (QGraphicsScenePrivate *this,QGraphicsItem *item,bool enabled)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsItem *pQVar2;
  long in_FS_OFFSET;
  void *local_28;
  char *pcStack_20;
  QMetaTypeInterface *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = ((item->d_ptr).d)->parent;
  if (pQVar2 != (QGraphicsItem *)0x0) {
    do {
      pQVar1 = (pQVar2->d_ptr).d;
      *(uint *)&pQVar1->field_0x168 =
           *(uint *)&pQVar1->field_0x168 & 0xffffff7f | (uint)enabled << 7;
      pQVar2 = ((pQVar2->d_ptr).d)->parent;
    } while (pQVar2 != (QGraphicsItem *)0x0);
  }
  if ((!enabled) && ((*(uint *)&this->field_0xb8 >> 8 & 1) == 0)) {
    *(uint *)&this->field_0xb8 = *(uint *)&this->field_0xb8 | 0x100;
    local_28 = (void *)0x0;
    pcStack_20 = (char *)0x0;
    local_18[0] = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              (*(QObject **)&this->field_0x8,"_q_updateScenePosDescendants",QueuedConnection,1,
               &local_28,&pcStack_20,local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::setScenePosItemEnabled(QGraphicsItem *item, bool enabled)
{
    QGraphicsItem *p = item->d_ptr->parent;
    while (p) {
        p->d_ptr->scenePosDescendants = enabled;
        p = p->d_ptr->parent;
    }
    if (!enabled && !scenePosDescendantsUpdatePending) {
        scenePosDescendantsUpdatePending = true;
        QMetaObject::invokeMethod(q_func(), "_q_updateScenePosDescendants", Qt::QueuedConnection);
    }
}